

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeINTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  uint uVar1;
  Expr *p;
  WhereLoop *pWVar2;
  Index *pIVar3;
  Vdbe *p_00;
  WhereInfo *pWVar4;
  InLoop *__src;
  size_t __n;
  sqlite3 *db;
  ExprList *pList;
  Expr *pEVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  u32 uVar9;
  WhereMemBlock *pWVar10;
  long lVar11;
  Expr *pX;
  ExprList *pList_00;
  ExprList *pList_01;
  anon_union_4_2_6146edf4_for_u *paVar12;
  int iVar13;
  long lVar14;
  Select *pSVar15;
  u8 uVar16;
  ulong uVar17;
  InLoop *pIVar18;
  int op;
  long lVar19;
  int p3;
  uint uVar20;
  ExprList *pList_02;
  long in_FS_OFFSET;
  Expr *pExpr;
  int iTab;
  int *local_b8;
  byte local_80;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pTerm->pExpr;
  local_3c = -0x55555556;
  pWVar2 = pLevel->pWLoop;
  if ((((pWVar2->wsFlags & 0x400) == 0) &&
      (pIVar3 = (pWVar2->u).btree.pIndex, pIVar3 != (Index *)0x0)) &&
     (pIVar3->aSortOrder[iEq] != '\0')) {
    bRev = (int)(bRev == 0);
  }
  p_00 = pParse->pVdbe;
  if (0 < iEq) {
    uVar17 = 0;
    do {
      if ((pWVar2->aLTerm[uVar17] != (WhereTerm *)0x0) && (pWVar2->aLTerm[uVar17]->pExpr == p)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          disableTerm(pLevel,pTerm);
          return;
        }
        goto LAB_001a13f1;
      }
      uVar17 = uVar17 + 1;
    } while ((uint)iEq != uVar17);
  }
  iVar6 = 0;
  if (iEq < (int)(uint)pWVar2->nLTerm) {
    uVar17 = (ulong)iEq;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)(pWVar2->aLTerm[uVar17]->pExpr == p);
      uVar17 = uVar17 + 1;
    } while (pWVar2->nLTerm != uVar17);
  }
  local_3c = 0;
  if (((p->flags >> 0xc & 1) == 0) || (((p->x).pSelect)->pEList->nExpr == 1)) {
    local_b8 = (int *)0x0;
  }
  else {
    if (((p->flags >> 0x19 & 1) == 0) || (p->iTable == 0)) {
      db = pParse->db;
      if (p == (Expr *)0x0) {
        pX = (Expr *)0x0;
      }
      else {
        pX = exprDup(db,p,0,(EdupBuf *)0x0);
      }
      if ((db->mallocFailed == '\0') && (pSVar15 = (pX->x).pSelect, pSVar15 != (Select *)0x0)) {
        do {
          if (pSVar15 == (Select *)(pX->x).pList) {
            pList_02 = (pX->pLeft->x).pList;
          }
          else {
            pList_02 = (ExprList *)0x0;
          }
          pList = pSVar15->pEList;
          if (iEq < (int)(uint)pWVar2->nLTerm) {
            pList_01 = (ExprList *)0x0;
            pList_00 = (ExprList *)0x0;
            lVar14 = (long)iEq;
            do {
              if (pWVar2->aLTerm[lVar14]->pExpr == p) {
                iVar7 = (pWVar2->aLTerm[lVar14]->u).x.iField;
                pEVar5 = pList->a[(long)iVar7 + -1].pExpr;
                if (pEVar5 != (Expr *)0x0) {
                  pList_00 = sqlite3ExprListAppend(pParse,pList_00,pEVar5);
                  pList->a[(long)iVar7 + -1].pExpr = (Expr *)0x0;
                  if (pList_00 != (ExprList *)0x0) {
                    pList_00->a[(long)pList_00->nExpr + -1].u.x.iOrderByCol = (u16)iVar7;
                  }
                  if (pList_02 != (ExprList *)0x0) {
                    pList_01 = sqlite3ExprListAppend
                                         (pParse,pList_01,pList_02->a[(long)iVar7 + -1].pExpr);
                    pList_02->a[(long)iVar7 + -1].pExpr = (Expr *)0x0;
                  }
                }
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < (long)(ulong)pWVar2->nLTerm);
          }
          else {
            pList_00 = (ExprList *)0x0;
            pList_01 = (ExprList *)0x0;
          }
          if (pList != (ExprList *)0x0) {
            exprListDeleteNN(db,pList);
          }
          if (pList_02 != (ExprList *)0x0) {
            exprListDeleteNN(db,pList_02);
            (pX->pLeft->x).pList = pList_01;
          }
          pSVar15->pEList = pList_00;
          uVar9 = pParse->nSelect + 1;
          pParse->nSelect = uVar9;
          pSVar15->selId = uVar9;
          if ((pList_01 != (ExprList *)0x0) && (pList_01->nExpr == 1)) {
            pEVar5 = pList_01->a[0].pExpr;
            pList_01->a[0].pExpr = (Expr *)0x0;
            if (pX->pLeft != (Expr *)0x0) {
              sqlite3ExprDeleteNN(db,pX->pLeft);
            }
            pX->pLeft = pEVar5;
          }
          if (pList_00 != (ExprList *)0x0) {
            adjustOrderByCol(pSVar15->pOrderBy,pList_00);
            adjustOrderByCol(pSVar15->pGroupBy,pList_00);
            if (0 < pList_00->nExpr) {
              paVar12 = &pList_00->a[0].u;
              lVar14 = 0;
              do {
                (paVar12->x).iOrderByCol = 0;
                lVar14 = lVar14 + 1;
                paVar12 = paVar12 + 6;
              } while (lVar14 < pList_00->nExpr);
            }
          }
          pSVar15 = pSVar15->pPrior;
        } while (pSVar15 != (Select *)0x0);
      }
      if (db->mallocFailed == '\0') {
        local_b8 = (int *)sqlite3DbMallocZero(pParse->db,(long)iVar6 * 4);
        iVar7 = sqlite3FindInIndex(pParse,pX,4,(int *)0x0,local_b8,&local_3c);
        p->iTable = local_3c;
      }
      else {
        iVar7 = 5;
        local_b8 = (int *)0x0;
      }
      if (pX != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,pX);
      }
      goto LAB_001a0d69;
    }
    pSVar15 = (Select *)p->pLeft;
    uVar16 = pSVar15->op;
    if (uVar16 == 0xb0) {
      uVar16 = (u8)pSVar15->nSelectRow;
    }
    if (uVar16 == 0xb1) {
LAB_001a10c4:
      iVar7 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr;
    }
    else {
      iVar7 = 1;
      if (uVar16 == 0x8b) {
        pSVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pSelect;
        goto LAB_001a10c4;
      }
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    local_b8 = (int *)sqlite3DbMallocZero(pParse->db,(long)iVar7 << 2);
  }
  iVar7 = sqlite3FindInIndex(pParse,p,4,(int *)0x0,local_b8,&local_3c);
LAB_001a0d69:
  uVar20 = (uint)(bRev == 0);
  if (iVar7 != 4) {
    uVar20 = bRev;
  }
  sqlite3VdbeAddOp3(p_00,(uint)(uVar20 == 0) * 4 + 0x20,local_3c,0,0);
  uVar1 = pWVar2->wsFlags;
  pWVar2->wsFlags = uVar1 | 0x800;
  if ((pLevel->u).in.nIn == 0) {
    iVar13 = pParse->nLabel + -1;
    pParse->nLabel = iVar13;
    pLevel->addrNxt = iVar13;
  }
  if ((0 < iEq) && ((uVar1 & 0x100000) == 0)) {
    pWVar2->wsFlags = uVar1 | 0x40800;
  }
  lVar19 = (long)(pLevel->u).in.nIn;
  lVar14 = iVar6 + lVar19;
  (pLevel->u).in.nIn = (int)lVar14;
  pWVar4 = pTerm->pWC->pWInfo;
  __src = (pLevel->u).in.aInLoop;
  pWVar10 = (WhereMemBlock *)sqlite3DbMallocRawNN(pWVar4->pParse->db,lVar14 * 0x14 + 0x10);
  if (pWVar10 == (WhereMemBlock *)0x0) {
    pIVar18 = (InLoop *)0x0;
  }
  else {
    pWVar10->pNext = pWVar4->pMemToFree;
    pWVar10->sz = lVar14 * 0x14;
    pWVar4->pMemToFree = pWVar10;
    pIVar18 = (InLoop *)(pWVar10 + 1);
  }
  if ((__src != (InLoop *)0x0) && (pIVar18 != (InLoop *)0x0)) {
    __n._0_4_ = __src[-1].nPrefix;
    __n._4_1_ = __src[-1].eEndLoopOp;
    __n._5_3_ = *(undefined3 *)&__src[-1].field_0x11;
    memcpy(pIVar18,__src,__n);
  }
  (pLevel->u).in.aInLoop = pIVar18;
  if (pIVar18 == (InLoop *)0x0) {
    (pLevel->u).in.nIn = 0;
  }
  else {
    if (iEq < (int)(uint)pWVar2->nLTerm) {
      pIVar18 = pIVar18 + lVar19;
      iVar13 = iTarget - iEq;
      local_80 = uVar20 == 0 | 0x26;
      lVar14 = (long)iEq;
      lVar19 = 0;
      iVar6 = 0;
      do {
        if (pWVar2->aLTerm[lVar14]->pExpr == p) {
          if (iVar7 == 1) {
            op = 0x87;
            iVar8 = iTarget;
            p3 = 0;
          }
          else {
            if (local_b8 == (int *)0x0) {
              iVar8 = 0;
            }
            else {
              lVar11 = (long)iVar6;
              iVar6 = iVar6 + 1;
              iVar8 = local_b8[lVar11];
            }
            op = 0x5e;
            p3 = iTarget;
          }
          iVar8 = sqlite3VdbeAddOp3(p_00,op,local_3c,iVar8,p3);
          pIVar18->addrInTop = iVar8;
          sqlite3VdbeAddOp3(p_00,0x33,iTarget,0,0);
          if (lVar19 == 0) {
            pIVar18->iCur = local_3c;
            pIVar18->eEndLoopOp = local_80;
            if (iEq < 1) {
              pIVar18->nPrefix = 0;
            }
            else {
              pIVar18->iBase = iVar13;
              pIVar18->nPrefix = (int)lVar14;
            }
          }
          else {
            pIVar18->eEndLoopOp = 0xbb;
          }
          pIVar18 = pIVar18 + 1;
        }
        lVar14 = lVar14 + 1;
        lVar19 = lVar19 + -1;
        iTarget = iTarget + 1;
      } while (lVar14 < (long)(ulong)pWVar2->nLTerm);
    }
    if ((0 < iEq) && ((pWVar2->wsFlags & 0x100400) == 0)) {
      sqlite3VdbeAddOp3(p_00,0x7d,pLevel->iIdxCur,0,iEq);
    }
  }
  if (local_b8 == (int *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3DbFreeNN(pParse->db,local_b8);
    return;
  }
LAB_001a13f1:
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void codeINTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  int eType = IN_INDEX_NOOP;
  int iTab;
  struct InLoop *pIn;
  WhereLoop *pLoop = pLevel->pWLoop;
  Vdbe *v = pParse->pVdbe;
  int i;
  int nEq = 0;
  int *aiMap = 0;

  if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
    && pLoop->u.btree.pIndex!=0
    && pLoop->u.btree.pIndex->aSortOrder[iEq]
  ){
    testcase( iEq==0 );
    testcase( bRev );
    bRev = !bRev;
  }
  assert( pX->op==TK_IN );

  for(i=0; i<iEq; i++){
    if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
      disableTerm(pLevel, pTerm);
      return;
    }
  }
  for(i=iEq;i<pLoop->nLTerm; i++){
    assert( pLoop->aLTerm[i]!=0 );
    if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
  }

  iTab = 0;
  if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
    eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
  }else{
    Expr *pExpr = pTerm->pExpr;
    if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
        pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
    }else{
      int n = sqlite3ExprVectorSize(pX->pLeft);
      aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
    }
    pX = pExpr;
  }

  if( eType==IN_INDEX_INDEX_DESC ){
    testcase( bRev );
    bRev = !bRev;
  }
  sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
  VdbeCoverageIf(v, bRev);
  VdbeCoverageIf(v, !bRev);

  assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
  pLoop->wsFlags |= WHERE_IN_ABLE;
  if( pLevel->u.in.nIn==0 ){
    pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
  }
  if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
    pLoop->wsFlags |= WHERE_IN_EARLYOUT;
  }

  i = pLevel->u.in.nIn;
  pLevel->u.in.nIn += nEq;
  pLevel->u.in.aInLoop =
     sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                         pLevel->u.in.aInLoop,
                         sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
  pIn = pLevel->u.in.aInLoop;
  if( pIn ){
    int iMap = 0;               /* Index in aiMap[] */
    pIn += i;
    for(i=iEq;i<pLoop->nLTerm; i++){
      if( pLoop->aLTerm[i]->pExpr==pX ){
        int iOut = iTarget + i - iEq;
        if( eType==IN_INDEX_ROWID ){
          pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
        }else{
          int iCol = aiMap ? aiMap[iMap++] : 0;
          pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
        }
        sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
        if( i==iEq ){
          pIn->iCur = iTab;
          pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
          if( iEq>0 ){
            pIn->iBase = iTarget - i;
            pIn->nPrefix = i;
          }else{
            pIn->nPrefix = 0;
          }
        }else{
          pIn->eEndLoopOp = OP_Noop;
        }
        pIn++;
      }
    }
    testcase( iEq>0
              && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
              && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
    if( iEq>0
     && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
    ){
      sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
    }
  }else{
    pLevel->u.in.nIn = 0;
  }
  sqlite3DbFree(pParse->db, aiMap);
}